

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instructions_list.c
# Opt level: O1

void vpscatterdps(PDISASM pMyDisasm)

{
  char *pcVar1;
  UInt8 UVar2;
  Int32 IVar3;
  Int32 IVar4;
  
  if (((pMyDisasm->Reserved_).EVEX.state != '\x01') || ((pMyDisasm->Reserved_).VEX.pp != '\x01')) {
    builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"???",4);
    (pMyDisasm->Operand1).AccessMode = 0;
    (pMyDisasm->Operand2).AccessMode = 0;
    (pMyDisasm->Operand3).AccessMode = 0;
    (pMyDisasm->Operand4).AccessMode = 0;
    (pMyDisasm->Operand5).AccessMode = 0;
    (pMyDisasm->Operand6).AccessMode = 0;
    (pMyDisasm->Operand7).AccessMode = 0;
    (pMyDisasm->Operand8).AccessMode = 0;
    (pMyDisasm->Operand9).AccessMode = 0;
    (pMyDisasm->Reserved_).ERROR_OPCODE = -1;
    return;
  }
  (pMyDisasm->Instruction).Category = 0x140000;
  pcVar1 = (pMyDisasm->Instruction).Mnemonic;
  if ((pMyDisasm->Reserved_).EVEX.W == '\0') {
    builtin_strncpy(pcVar1,"vscatterdps",0xc);
    UVar2 = (pMyDisasm->Reserved_).VEX.L;
    if (UVar2 == '\0') goto LAB_00134128;
    if (UVar2 == '\x01') {
      IVar3 = 8;
      goto LAB_0013411c;
    }
    IVar3 = 0x10;
    IVar4 = 0x10;
    if ((pMyDisasm->Reserved_).EVEX.LL != '\x02') goto LAB_00134139;
  }
  else {
    builtin_strncpy(pcVar1,"vscatterdpd",0xc);
    UVar2 = (pMyDisasm->Reserved_).VEX.L;
    IVar3 = 4;
    if (UVar2 == '\0') {
LAB_00134128:
      IVar3 = 4;
      IVar4 = 4;
    }
    else if (UVar2 == '\x01') {
LAB_0013411c:
      IVar4 = 8;
    }
    else {
      if ((pMyDisasm->Reserved_).EVEX.LL != '\x02') goto LAB_00134139;
      IVar4 = 0x10;
      IVar3 = 8;
    }
  }
  (pMyDisasm->Reserved_).VSIB_ = IVar3;
  (pMyDisasm->Reserved_).Register_ = IVar4;
LAB_00134139:
  (pMyDisasm->Reserved_).EVEX.masking = '\x01';
  (pMyDisasm->Reserved_).EVEX.tupletype = '\x06';
  (pMyDisasm->Reserved_).MemDecoration = 3;
  decodeModrm(&pMyDisasm->Operand1,pMyDisasm);
  decodeRegOpcode(&pMyDisasm->Operand2,pMyDisasm);
  (pMyDisasm->Reserved_).EIP_ =
       (pMyDisasm->Reserved_).EIP_ + (ulong)((pMyDisasm->Reserved_).DECALAGE_EIP + 2);
  return;
}

Assistant:

void __bea_callspec__ vpscatterdps(PDISASM pMyDisasm)
{
  if (GV.EVEX.state == InUsePrefix) {
    if (GV.VEX.pp == 1) {
      pMyDisasm->Instruction.Category = AVX512_INSTRUCTION;
      if (GV.EVEX.W == 0) {
        #ifndef BEA_LIGHT_DISASSEMBLY
           (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vscatterdps");
        #endif
        if (GV.VEX.L == 0) {
          GV.VSIB_ = SSE_REG;
          GV.Register_ = SSE_REG;
        }
        else if (GV.VEX.L == 0x1) {
          GV.VSIB_ = AVX_REG;
          GV.Register_ = AVX_REG;
        }
        else if (GV.EVEX.LL == 0x2) {
          GV.VSIB_ = AVX512_REG;
          GV.Register_ = AVX512_REG;
        }
      }
      else {
        #ifndef BEA_LIGHT_DISASSEMBLY
           (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vscatterdpd");
        #endif
        if (GV.VEX.L == 0) {
          GV.VSIB_ = SSE_REG;
          GV.Register_ = SSE_REG;
        }
        else if (GV.VEX.L == 0x1) {
          GV.VSIB_ = SSE_REG;
          GV.Register_ = AVX_REG;
        }
        else if (GV.EVEX.LL == 0x2) {
          GV.VSIB_ = AVX_REG;
          GV.Register_ = AVX512_REG;
        }
      }
      GV.EVEX.masking = MERGING;
      GV.EVEX.tupletype = TUPLE1_SCALAR;
      GV.MemDecoration = Arg1dword;
      ExGx(pMyDisasm);
    }
    else {
      failDecode(pMyDisasm);
    }
  }
  else {
    failDecode(pMyDisasm);
  }
}